

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

quicly_stream_t *
open_stream(quicly_conn_t *conn,uint64_t stream_id,uint32_t initial_max_stream_data_local,
           uint64_t initial_max_stream_data_remote)

{
  khint_t kVar1;
  quicly_stream_t *initial_max_stream_data_remote_00;
  undefined8 in_RCX;
  undefined4 in_EDX;
  int *in_RSI;
  quicly_conn_t *in_RDI;
  khiter_t iter;
  int r;
  quicly_stream_t *stream;
  uint32_t initial_max_stream_data_local_00;
  undefined4 in_stack_ffffffffffffffe0;
  kh_quicly_stream_t_t *in_stack_fffffffffffffff8;
  
  initial_max_stream_data_local_00 = (uint32_t)((ulong)in_RCX >> 0x20);
  initial_max_stream_data_remote_00 = (quicly_stream_t *)malloc(0x128);
  if (initial_max_stream_data_remote_00 == (quicly_stream_t *)0x0) {
    initial_max_stream_data_remote_00 = (quicly_stream_t *)0x0;
  }
  else {
    initial_max_stream_data_remote_00->conn = in_RDI;
    initial_max_stream_data_remote_00->stream_id = (quicly_stream_id_t)in_RSI;
    initial_max_stream_data_remote_00->callbacks = (quicly_stream_callbacks_t *)0x0;
    initial_max_stream_data_remote_00->data = (void *)0x0;
    kVar1 = kh_put_quicly_stream_t(in_stack_fffffffffffffff8,(khint64_t)in_RDI,in_RSI);
    if (kVar1 == in_RDI->streams->n_buckets) {
      __assert_fail("iter != kh_end(conn->streams)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x42b,
                    "quicly_stream_t *open_stream(quicly_conn_t *, uint64_t, uint32_t, uint64_t)");
    }
    in_RDI->streams->vals[kVar1] = initial_max_stream_data_remote_00;
    init_stream_properties
              ((quicly_stream_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
               initial_max_stream_data_local_00,(uint64_t)initial_max_stream_data_remote_00);
  }
  return initial_max_stream_data_remote_00;
}

Assistant:

static quicly_stream_t *open_stream(quicly_conn_t *conn, uint64_t stream_id, uint32_t initial_max_stream_data_local,
                                    uint64_t initial_max_stream_data_remote)
{
    quicly_stream_t *stream;

    if ((stream = malloc(sizeof(*stream))) == NULL)
        return NULL;
    stream->conn = conn;
    stream->stream_id = stream_id;
    stream->callbacks = NULL;
    stream->data = NULL;

    int r;
    khiter_t iter = kh_put(quicly_stream_t, conn->streams, stream_id, &r);
    assert(iter != kh_end(conn->streams));
    kh_val(conn->streams, iter) = stream;

    init_stream_properties(stream, initial_max_stream_data_local, initial_max_stream_data_remote);

    return stream;
}